

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_clear(JPCommonLabel *label)

{
  void *pvVar1;
  _JPCommonLabelBreathGroup *p_Var2;
  int *in_RDI;
  JPCommonLabelBreathGroup *bn;
  JPCommonLabelBreathGroup *b;
  JPCommonLabelAccentPhrase *an;
  JPCommonLabelAccentPhrase *a;
  JPCommonLabelWord *wn;
  JPCommonLabelWord *w;
  JPCommonLabelMora *mn;
  JPCommonLabelMora *m;
  JPCommonLabelPhoneme *pn;
  JPCommonLabelPhoneme *p;
  int i;
  JPCommonLabelBreathGroup *local_58;
  void *local_48;
  void *local_38;
  void *local_28;
  void *local_18;
  int local_c;
  
  local_18 = *(void **)(in_RDI + 0x14);
  while (local_18 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_18 + 0x10);
    JPCommonLabelPhoneme_clear((JPCommonLabelPhoneme *)0x209077);
    free(local_18);
    local_18 = pvVar1;
  }
  local_28 = *(void **)(in_RDI + 0x10);
  while (local_28 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_28 + 0x20);
    JPCommonLabelMora_clear((JPCommonLabelMora *)0x2090bb);
    free(local_28);
    local_28 = pvVar1;
  }
  local_38 = *(void **)(in_RDI + 0xc);
  while (local_38 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_38 + 0x38);
    JPCommonLabelWord_clear((JPCommonLabelWord *)0x2090ff);
    free(local_38);
    local_38 = pvVar1;
  }
  local_48 = *(void **)(in_RDI + 8);
  while (local_48 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_48 + 0x28);
    JPCommonLabelAccentPhrase_clear((JPCommonLabelAccentPhrase *)0x209143);
    free(local_48);
    local_48 = pvVar1;
  }
  local_58 = *(JPCommonLabelBreathGroup **)(in_RDI + 4);
  while (local_58 != (JPCommonLabelBreathGroup *)0x0) {
    p_Var2 = local_58->next;
    JPCommonLabelBreathGroup_clear(local_58);
    free(local_58);
    local_58 = p_Var2;
  }
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      free(*(void **)(*(long *)(in_RDI + 2) + (long)local_c * 8));
    }
    free(*(void **)(in_RDI + 2));
  }
  return;
}

Assistant:

void JPCommonLabel_clear(JPCommonLabel * label)
{
   int i;
   JPCommonLabelPhoneme *p, *pn;
   JPCommonLabelMora *m, *mn;
   JPCommonLabelWord *w, *wn;
   JPCommonLabelAccentPhrase *a, *an;
   JPCommonLabelBreathGroup *b, *bn;

   for (p = label->phoneme_head; p != NULL; p = pn) {
      pn = p->next;
      JPCommonLabelPhoneme_clear(p);
      free(p);
   }
   for (m = label->mora_head; m != NULL; m = mn) {
      mn = m->next;
      JPCommonLabelMora_clear(m);
      free(m);
   }
   for (w = label->word_head; w != NULL; w = wn) {
      wn = w->next;
      JPCommonLabelWord_clear(w);
      free(w);
   }
   for (a = label->accent_head; a != NULL; a = an) {
      an = a->next;
      JPCommonLabelAccentPhrase_clear(a);
      free(a);
   }
   for (b = label->breath_head; b != NULL; b = bn) {
      bn = b->next;
      JPCommonLabelBreathGroup_clear(b);
      free(b);
   }
   if (label->feature != NULL) {
      for (i = 0; i < label->size; i++)
         free(label->feature[i]);
      free(label->feature);
   }
}